

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O2

int __thiscall
rr::MultiSampleLineRasterizer::init(MultiSampleLineRasterizer *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  Vector<float,_4> *in_RDX;
  float in_XMM0_Da;
  float s;
  Vec4 p1;
  Vec4 p3;
  Vec4 p2;
  Vec2 normal2;
  Vec4 p0;
  Vec2 lineVec;
  VecAccess<float,_4,_2> local_a0;
  VecAccess<float,_4,_2> local_90;
  Vector<float,_2> local_80 [2];
  Vector<float,_4> local_70;
  Vector<float,_4> *local_60;
  Vector<float,_2> local_58 [2];
  tcu local_48 [16];
  undefined4 local_38;
  undefined4 local_34;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_48,in_RDX);
  local_90.m_index[0] = 0;
  local_90.m_index[1] = 1;
  local_90.m_vector = (Vector<float,_4> *)local_48;
  tcu::VecAccess::operator_cast_to_Vector(&local_90);
  tcu::Vector<float,_4>::Vector(&local_70,(Vector<float,_4> *)ctx);
  local_a0.m_index[0] = 0;
  local_a0.m_index[1] = 1;
  local_a0.m_vector = &local_70;
  tcu::VecAccess::operator_cast_to_Vector(&local_a0);
  tcu::operator-(local_80,local_58);
  local_90.m_vector = (Vector<float,_4> *)(CONCAT44(local_38,local_34) ^ 0x80000000);
  tcu::normalize<float,2>((tcu *)&local_60,(Vector<float,_2> *)&local_90);
  local_90.m_vector = local_60;
  local_90.m_index[0] = 0;
  local_90.m_index[1] = 0;
  s = in_XMM0_Da * 0.5;
  tcu::operator*((tcu *)&local_a0,s,(Vector<float,_4> *)&local_90);
  tcu::operator+(local_48,(Vector<float,_4> *)ctx,(Vector<float,_4> *)&local_a0);
  tcu::operator*((tcu *)&local_70,s,(Vector<float,_4> *)&local_90);
  tcu::operator-((tcu *)&local_a0,(Vector<float,_4> *)ctx,&local_70);
  tcu::operator*((tcu *)local_80,s,(Vector<float,_4> *)&local_90);
  tcu::operator-((tcu *)&local_70,in_RDX,(Vector<float,_4> *)local_80);
  tcu::operator*((tcu *)local_58,s,(Vector<float,_4> *)&local_90);
  tcu::operator+((tcu *)local_80,in_RDX,(Vector<float,_4> *)local_58);
  TriangleRasterizer::init(&this->m_triangleRasterizer0,(EVP_PKEY_CTX *)local_48);
  iVar1 = TriangleRasterizer::init(&this->m_triangleRasterizer1,(EVP_PKEY_CTX *)&local_70);
  return iVar1;
}

Assistant:

void MultiSampleLineRasterizer::init (const tcu::Vec4& v0, const tcu::Vec4& v1, float lineWidth)
{
	// allow creation of single sampled rasterizer objects but do not allow using them
	DE_ASSERT(m_numSamples > 1);

	const tcu::Vec2 lineVec		= tcu::Vec2(tcu::Vec4(v1).xy()) - tcu::Vec2(tcu::Vec4(v0).xy());
	const tcu::Vec2 normal2		= tcu::normalize(tcu::Vec2(-lineVec[1], lineVec[0]));
	const tcu::Vec4 normal4		= tcu::Vec4(normal2.x(), normal2.y(), 0, 0);
	const float offset			= lineWidth / 2.0f;

	const tcu::Vec4 p0 = v0 + normal4 * offset;
	const tcu::Vec4 p1 = v0 - normal4 * offset;
	const tcu::Vec4 p2 = v1 - normal4 * offset;
	const tcu::Vec4 p3 = v1 + normal4 * offset;

	// Edge 0 -> 1 is always along the line and edge 1 -> 2 is in 90 degree angle to the line
	m_triangleRasterizer0.init(p0, p3, p2);
	m_triangleRasterizer1.init(p2, p1, p0);
}